

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_INT_CXX.cxx
# Opt level: O0

int test_INT_CXX(void)

{
  int iVar1;
  uint local_c;
  
  iVar1 = test_INT_format();
  local_c = (uint)(iVar1 != 0);
  return local_c;
}

Assistant:

int test_INT_CXX(void)
{
  if(!test_INT_format())
    {
    return 0;
    }
  return 1;
}